

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex_test.cpp
# Opt level: O0

void * looper(void *param_1)

{
  uint local_14;
  uint i;
  void *param_0_local;
  
  for (local_14 = 0; local_14 < 100000; local_14 = local_14 + 1) {
    Fossilize::futex_wrapper_lock(&lock);
    global_variable = global_variable + 1;
    Fossilize::futex_wrapper_unlock(&lock);
  }
  return (void *)0x0;
}

Assistant:

static void *looper(void *)
{
	for (unsigned i = 0; i < num_iterations; i++)
	{
		Fossilize::futex_wrapper_lock(&lock);
		global_variable++;
		Fossilize::futex_wrapper_unlock(&lock);
	}
	return nullptr;
}